

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O2

s32 __thiscall irr::gui::CGUITabControl::getTabAt(CGUITabControl *this,s32 xpos,s32 ypos)

{
  pointer ppIVar1;
  IGUITab *pIVar2;
  int iVar3;
  s32 sVar4;
  long *plVar5;
  IGUIFont *font;
  wchar_t *text;
  bool bVar6;
  int iVar7;
  uint uVar8;
  
  plVar5 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  font = (IGUIFont *)(**(code **)(*plVar5 + 0x30))(plVar5,0);
  if (this->VerticalAlignment == EGUIA_UPPERLEFT) {
    iVar7 = *(int *)&this->field_0x44 + 2;
    iVar3 = this->TabHeight + iVar7;
  }
  else {
    iVar3 = *(int *)&this->field_0x4c;
    iVar7 = iVar3 - this->TabHeight;
  }
  if ((((*(int *)&this->field_0x40 <= xpos) && (iVar7 <= ypos)) &&
      (xpos <= *(int *)&this->field_0x48)) && (ypos <= iVar3)) {
    uVar8 = this->CurrentScrollTabIndex;
    bVar6 = false;
    iVar3 = *(int *)&this->field_0x40 + 2;
    while ((ppIVar1 = (this->Tabs).m_data.
                      super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
           (int)uVar8 <
           (int)((ulong)((long)(this->Tabs).m_data.
                               super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3) &&
           (!bVar6))) {
      pIVar2 = ppIVar1[uVar8];
      if (pIVar2 == (IGUITab *)0x0) {
        text = (wchar_t *)0x0;
      }
      else {
        text = (wchar_t *)
               (**(code **)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + 0xa8))();
      }
      sVar4 = calcTabWidth(this,font,text);
      if (this->ScrollControl == true) {
        iVar7 = ((this->UpButton->super_IGUIElement).AbsoluteRect.UpperLeftCorner.X - iVar3) + -2;
        bVar6 = iVar7 < sVar4;
        if (iVar7 < sVar4) {
          sVar4 = iVar7;
        }
      }
      else {
        bVar6 = false;
      }
      if (iVar3 <= xpos && xpos <= sVar4 + iVar3) {
        return uVar8;
      }
      uVar8 = uVar8 + 1;
      iVar3 = sVar4 + iVar3;
    }
  }
  return 0xffffffff;
}

Assistant:

s32 CGUITabControl::getTabAt(s32 xpos, s32 ypos) const
{
	core::position2di p(xpos, ypos);
	IGUISkin *skin = Environment->getSkin();
	IGUIFont *font = skin->getFont();

	core::rect<s32> frameRect(AbsoluteRect);

	if (VerticalAlignment == EGUIA_UPPERLEFT) {
		frameRect.UpperLeftCorner.Y += 2;
		frameRect.LowerRightCorner.Y = frameRect.UpperLeftCorner.Y + TabHeight;
	} else {
		frameRect.UpperLeftCorner.Y = frameRect.LowerRightCorner.Y - TabHeight;
	}

	s32 pos = frameRect.UpperLeftCorner.X + 2;

	if (!frameRect.isPointInside(p))
		return -1;

	bool abort = false;
	for (s32 i = CurrentScrollTabIndex; i < (s32)Tabs.size() && !abort; ++i) {
		// get Text
		const wchar_t *text = 0;
		if (Tabs[i])
			text = Tabs[i]->getText();

		// get text length
		s32 len = calcTabWidth(font, text);
		if (ScrollControl) {
			// TODO: merge this with draw() ?
			s32 space = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2 - pos;
			if (space < len) {
				abort = true;
				len = space;
			}
		}

		frameRect.UpperLeftCorner.X = pos;
		frameRect.LowerRightCorner.X = frameRect.UpperLeftCorner.X + len;

		pos += len;

		if (frameRect.isPointInside(p)) {
			return i;
		}
	}
	return -1;
}